

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O0

Vec_Ptr_t * Nwk_ManDfsNodes(Nwk_Man_t *pNtk,Nwk_Obj_t **ppNodes,int nNodes)

{
  int iVar1;
  Vec_Ptr_t *vNodes_00;
  Nwk_Obj_t *pObj;
  int local_2c;
  int i;
  Vec_Ptr_t *vNodes;
  int nNodes_local;
  Nwk_Obj_t **ppNodes_local;
  Nwk_Man_t *pNtk_local;
  
  Nwk_ManIncrementTravId(pNtk);
  vNodes_00 = Vec_PtrAlloc(100);
  for (local_2c = 0; local_2c < nNodes; local_2c = local_2c + 1) {
    iVar1 = Nwk_ObjIsCo(ppNodes[local_2c]);
    if (iVar1 == 0) {
      Nwk_ManDfsNodes_rec(ppNodes[local_2c],vNodes_00);
    }
    else {
      pObj = Nwk_ObjFanin0(ppNodes[local_2c]);
      Nwk_ManDfsNodes_rec(pObj,vNodes_00);
    }
  }
  return vNodes_00;
}

Assistant:

Vec_Ptr_t * Nwk_ManDfsNodes( Nwk_Man_t * pNtk, Nwk_Obj_t ** ppNodes, int nNodes )
{
    Vec_Ptr_t * vNodes;
    int i;
    // set the traversal ID
    Nwk_ManIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    // go through the PO nodes and call for each of them
    for ( i = 0; i < nNodes; i++ )
        if ( Nwk_ObjIsCo(ppNodes[i]) )
            Nwk_ManDfsNodes_rec( Nwk_ObjFanin0(ppNodes[i]), vNodes );
        else
            Nwk_ManDfsNodes_rec( ppNodes[i], vNodes );
    return vNodes;
}